

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

ParseLocationRange __thiscall
google::protobuf::TextFormat::ParseInfoTree::GetLocationRange
          (ParseInfoTree *this,FieldDescriptor *field,int index)

{
  pointer pPVar1;
  second_type *psVar2;
  ParseLocation PVar3;
  int iVar4;
  ParseLocation PVar5;
  long lVar6;
  ParseLocationRange PVar7;
  FieldDescriptor *field_local;
  
  field_local = field;
  CheckFieldIndex(field,index);
  psVar2 = FindOrNull<std::map<google::protobuf::FieldDescriptor_const*,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>>>>>
                     (&this->locations_,&field_local);
  PVar3.line = -1;
  PVar3.column = -1;
  PVar5 = PVar3;
  if (psVar2 != (second_type *)0x0) {
    iVar4 = 0;
    if (index != -1) {
      iVar4 = index;
    }
    lVar6 = (long)iVar4;
    pPVar1 = (psVar2->
             super__Vector_base<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (lVar6 < (long)(psVar2->
                      super__Vector_base<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 4) {
      PVar3 = pPVar1[lVar6].start;
      PVar5 = pPVar1[lVar6].end;
    }
  }
  PVar7.end = PVar5;
  PVar7.start = PVar3;
  return PVar7;
}

Assistant:

TextFormat::ParseLocationRange TextFormat::ParseInfoTree::GetLocationRange(
    const FieldDescriptor* field, int index) const {
  CheckFieldIndex(field, index);
  if (index == -1) {
    index = 0;
  }

  const std::vector<TextFormat::ParseLocationRange>* locations =
      FindOrNull(locations_, field);
  if (locations == nullptr ||
      index >= static_cast<int64_t>(locations->size())) {
    return TextFormat::ParseLocationRange();
  }

  return (*locations)[index];
}